

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmELF.cxx
# Opt level: O0

DynamicEntryList * __thiscall
cmELF::GetDynamicEntries(DynamicEntryList *__return_storage_ptr__,cmELF *this)

{
  bool bVar1;
  pointer pcVar2;
  cmELF *this_local;
  
  bVar1 = Valid(this);
  if (bVar1) {
    pcVar2 = std::unique_ptr<cmELFInternal,_std::default_delete<cmELFInternal>_>::operator->
                       (&this->Internal);
    (*pcVar2->_vptr_cmELFInternal[4])(__return_storage_ptr__);
  }
  else {
    memset(__return_storage_ptr__,0,0x18);
    std::vector<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>::
    vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

cmELF::DynamicEntryList cmELF::GetDynamicEntries() const
{
  if (this->Valid()) {
    return this->Internal->GetDynamicEntries();
  }

  return cmELF::DynamicEntryList();
}